

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int FE_Delete_Word(FORM *form)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *buf;
  
  iVar1 = form->current->dcols;
  buf = form->current->buf + (long)form->currow * (long)iVar1;
  iVar2 = form->curcol;
  Synchronize_Buffer(form);
  iVar5 = -0xc;
  if (buf[iVar2] != ' ') {
    iVar6 = iVar1 + (int)buf;
    pcVar4 = After_Last_Whitespace_Character(buf,form->curcol);
    Adjust_Cursor_Position(form,pcVar4);
    wmove(form->w,form->currow,form->curcol);
    wclrtoeol(form->w);
    pcVar4 = Get_First_Whitespace_Character(buf + iVar2,iVar1 - iVar2);
    pcVar4 = Get_Start_Of_Data(pcVar4,iVar6 - (int)pcVar4);
    iVar5 = 0;
    if ((pcVar4 != buf + iVar2) && (*pcVar4 != ' ')) {
      uVar7 = iVar6 - (int)pcVar4;
      if ((int)uVar7 < 0) {
        __assert_fail("buf && blen>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                      ,0xfb,"char *After_End_Of_Data(char *, int)");
      }
      uVar3 = (ulong)(uVar7 & 0x7fffffff);
      do {
        uVar8 = uVar3;
        if (pcVar4 + uVar8 <= pcVar4) break;
        uVar3 = uVar8 - 1;
      } while (pcVar4[uVar8 - 1] == ' ');
      waddnstr(form->w,pcVar4,-(int)uVar8);
    }
  }
  return iVar5;
}

Assistant:

static int FE_Delete_Word(FORM * form)
{
  FIELD  *field = form->current;
  char   *bp = Address_Of_Current_Row_In_Buffer(form);
  char   *ep = bp + field->dcols;
  char   *cp = bp + form->curcol;
  char *s;
  
  Synchronize_Buffer(form);
  if (is_blank(*cp)) 
    return E_REQUEST_DENIED; /* not in word */

  /* move cursor to begin of word and erase to end of screen-line */
  Adjust_Cursor_Position(form,
                         After_Last_Whitespace_Character(bp,form->curcol)); 
  wmove(form->w,form->currow,form->curcol);
  wclrtoeol(form->w);

  /* skip over word in buffer */
  s = Get_First_Whitespace_Character(cp,(int)(ep-cp)); 
  /* to begin of next word    */
  s = Get_Start_Of_Data(s,(int)(ep - s));
  if ( (s!=cp) && !is_blank(*s))
    {
      /* copy remaining line to window */
      waddnstr(form->w,s,(int)(s - After_End_Of_Data(s,(int)(ep - s))));
    }
  return E_OK;
}